

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathDistinctSorted(xmlNodeSetPtr nodes)

{
  int size;
  int iVar1;
  xmlNodeSetPtr cur;
  xmlHashTablePtr table;
  xmlChar *name;
  void *pvVar2;
  xmlNodePtr cur_00;
  uint uVar3;
  
  if (((nodes != (xmlNodeSetPtr)0x0) && (nodes->nodeNr != 0)) &&
     (nodes->nodeTab != (xmlNodePtr *)0x0)) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating nodeset\n");
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
    }
    if (cur == (xmlNodeSetPtr)0x0) {
      nodes = (xmlNodeSetPtr)0x0;
    }
    else {
      size = nodes->nodeNr;
      table = xmlHashCreate(size);
      if (0 < size) {
        uVar3 = 0;
        do {
          if ((int)uVar3 < nodes->nodeNr) {
            cur_00 = nodes->nodeTab[uVar3];
          }
          else {
            cur_00 = (xmlNode *)0x0;
          }
          name = xmlNodeGetContent(cur_00);
          if (name == (xmlChar *)0x0) {
            name = xmlStrdup("");
          }
          pvVar2 = xmlHashLookup(table,name);
          if (pvVar2 == (void *)0x0) {
            xmlHashAddEntry(table,name,name);
            iVar1 = xmlXPathNodeSetAddUnique(cur,cur_00);
            if (iVar1 < 0) break;
          }
          else {
            (*xmlFree)(name);
          }
          uVar3 = uVar3 + 1;
        } while ((int)uVar3 < size);
      }
      xmlHashFree(table,xmlHashDefaultDeallocator);
      nodes = cur;
    }
  }
  return nodes;
}

Assistant:

xmlNodeSetPtr
xmlXPathDistinctSorted (xmlNodeSetPtr nodes) {
    xmlNodeSetPtr ret;
    xmlHashTablePtr hash;
    int i, l;
    xmlChar * strval;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes))
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    l = xmlXPathNodeSetGetLength(nodes);
    hash = xmlHashCreate (l);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	strval = xmlXPathCastNodeToString(cur);
	if (xmlHashLookup(hash, strval) == NULL) {
	    xmlHashAddEntry(hash, strval, strval);
            /* TODO: Propagate memory error. */
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	        break;
	} else {
	    xmlFree(strval);
	}
    }
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    return(ret);
}